

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq2x_16.cpp
# Opt level: O2

void Interp10(uchar *pc,int c1,int c2,int c3)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar7;
  uint5 uVar6;
  ushort uVar8;
  uint5 uVar9;
  uint5 uVar10;
  
  uVar1 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)c1 >> 0x18) << 0x30) >> 0x28)
                                          ,CONCAT14((char)((uint)c1 >> 0x10),c1)) >> 0x20),c1) >>
                0x18);
  uVar10 = (uint5)uVar1 & 0xffffffff00;
  uVar2 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)c2 >> 0x18) << 0x30) >> 0x28)
                                          ,CONCAT14((char)((uint)c2 >> 0x10),c2)) >> 0x20),c2) >>
                0x18);
  uVar9 = (uint5)uVar2 & 0xffffffff00;
  uVar3 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)c3 >> 0x18) << 0x30) >> 0x28)
                                          ,CONCAT14((char)((uint)c3 >> 0x10),c3)) >> 0x20),c3) >>
                0x18);
  uVar6 = (uint5)uVar3 & 0xffffffff00;
  uVar4 = (ushort)((ushort)(byte)c3 + ((ushort)c2 & 0xff) + ((ushort)c1 & 0xff) * 0xe) >> 4;
  uVar5 = (ushort)(((ushort)CONCAT41(uVar3,(char)((uint)c3 >> 8)) & 0xff) +
                  ((ushort)(CONCAT43(uVar2,CONCAT12((char)((uint)c2 >> 8),(ushort)c2)) >> 0x10) &
                  0xff) + ((ushort)(CONCAT43(uVar1,CONCAT12((char)((uint)c1 >> 8),(ushort)c1)) >>
                                   0x10) & 0xff) * 0xe) >> 4;
  uVar7 = (ushort)((short)(uVar6 >> 8) + (short)(uVar9 >> 8) + (short)(uVar10 >> 8) * 0xe) >> 4;
  uVar8 = (ushort)((short)(uVar6 >> 0x18) + (short)(uVar9 >> 0x18) + (short)(uVar10 >> 0x18) * 0xe)
          >> 4;
  *(uint *)pc = CONCAT13((uVar8 != 0) * (uVar8 < 0x100) * (char)uVar8 - (0xff < uVar8),
                         CONCAT12((uVar7 != 0) * (uVar7 < 0x100) * (char)uVar7 - (0xff < uVar7),
                                  CONCAT11((uVar5 != 0) * (uVar5 < 0x100) * (char)uVar5 -
                                           (0xff < uVar5),
                                           (uVar4 != 0) * (uVar4 < 0x100) * (char)uVar4 -
                                           (0xff < uVar4))));
  return;
}

Assistant:

inline void Interp10(unsigned char * pc, int c1, int c2, int c3)
{
  // *((int*)pc) = (c1*14+c2+c3)/16;

  hq_vec result = hq_vec::load(c1);

  result *= const14;
  result += hq_vec::load(c2);
  result += hq_vec::load(c3);
  result >> 4;

  result.store(pc);
}